

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_atom.c
# Opt level: O0

t_symbol * atom_gensym(t_atom *a)

{
  char local_38 [8];
  char buf [30];
  t_atom *a_local;
  
  if (a->a_type == A_SYMBOL) {
    a_local = (t_atom *)(a->a_w).w_symbol;
  }
  else {
    unique0x100000ab = a;
    if (a->a_type == A_FLOAT) {
      sprintf(local_38,"%g",(double)(a->a_w).w_float);
    }
    else {
      strcpy(local_38,"???");
    }
    a_local = (t_atom *)gensym(local_38);
  }
  return (t_symbol *)a_local;
}

Assistant:

t_symbol *atom_gensym(const t_atom *a)  /* this works  better for graph labels */
{
    char buf[30];
    if (a->a_type == A_SYMBOL) return (a->a_w.w_symbol);
    else if (a->a_type == A_FLOAT)
        sprintf(buf, "%g", a->a_w.w_float);
    else strcpy(buf, "???");
    return (gensym(buf));
}